

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_iTXt(ucvector *out,uint compressed,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint extraout_EAX;
  uchar *in_RAX;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *data;
  uchar uVar9;
  size_t sVar10;
  ulong __size;
  bool bVar11;
  ucvector compressed_data;
  ulong local_88;
  uchar *local_58;
  size_t sStack_50;
  undefined8 local_48;
  uchar *local_40;
  uchar *local_38;
  
  sVar10 = 0xffffffffffffffff;
  do {
    lVar1 = sVar10 + 1;
    sVar10 = sVar10 + 1;
  } while (textstring[lVar1] != '\0');
  uVar9 = *keyword;
  local_40 = (uchar *)langtag;
  local_38 = (uchar *)transkey;
  if (uVar9 == '\0') {
    uVar3 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    data = (uchar *)0x0;
    uVar6 = 0;
    local_88 = 0;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    local_88 = 0;
    uVar6 = 0;
    data = (uchar *)0x0;
    do {
      uVar7 = uVar6 + 1;
      if (local_88 < uVar7) {
        __size = uVar7 * 3 >> 1;
        if (local_88 * 2 < uVar7) {
          __size = uVar7;
        }
        in_RAX = (uchar *)realloc(data,__size);
        bVar11 = in_RAX == (uchar *)0x0;
        if (!bVar11) {
          uVar6 = uVar7;
          data = in_RAX;
          local_88 = __size;
        }
      }
      else {
        bVar11 = false;
        uVar6 = uVar7;
      }
      if (!bVar11) {
        data[uVar6 - 1] = uVar9;
      }
      uVar9 = keyword[uVar8 + 2];
      uVar8 = uVar8 + 1;
    } while (uVar9 != '\0');
    uVar3 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),0x4e < uVar8);
  }
  if ((char)uVar3 == '\0') {
    uVar8 = uVar6 + 1;
    if (local_88 < uVar8) {
      uVar7 = uVar8 * 3 >> 1;
      if (local_88 * 2 < uVar8) {
        uVar7 = uVar8;
      }
      puVar4 = (uchar *)realloc(data,uVar7);
      if (puVar4 == (uchar *)0x0) {
        bVar11 = true;
        uVar8 = uVar6;
      }
      else {
        bVar11 = false;
        data = puVar4;
        local_88 = uVar7;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar8 - 1] = '\0';
    }
    uVar6 = uVar8 + 1;
    if (local_88 < uVar6) {
      uVar7 = uVar6 * 3 >> 1;
      if (local_88 * 2 < uVar6) {
        uVar7 = uVar6;
      }
      puVar4 = (uchar *)realloc(data,uVar7);
      if (puVar4 == (uchar *)0x0) {
        bVar11 = true;
        uVar6 = uVar8;
      }
      else {
        bVar11 = false;
        data = puVar4;
        local_88 = uVar7;
      }
    }
    else {
      bVar11 = false;
    }
    puVar4 = local_40;
    if (!bVar11) {
      data[uVar6 - 1] = compressed != 0;
    }
    uVar8 = uVar6 + 1;
    if (local_88 < uVar8) {
      uVar7 = uVar8 * 3 >> 1;
      if (local_88 * 2 < uVar8) {
        uVar7 = uVar8;
      }
      puVar5 = (uchar *)realloc(data,uVar7);
      if (puVar5 == (uchar *)0x0) {
        bVar11 = true;
        uVar8 = uVar6;
      }
      else {
        bVar11 = false;
        data = puVar5;
        local_88 = uVar7;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar8 - 1] = '\0';
    }
    uVar9 = *puVar4;
    while (uVar9 != '\0') {
      puVar4 = puVar4 + 1;
      uVar6 = uVar8 + 1;
      if (local_88 < uVar6) {
        uVar7 = uVar6 * 3 >> 1;
        if (local_88 * 2 < uVar6) {
          uVar7 = uVar6;
        }
        puVar5 = (uchar *)realloc(data,uVar7);
        if (puVar5 == (uchar *)0x0) {
          bVar11 = true;
          uVar6 = uVar8;
        }
        else {
          bVar11 = false;
          data = puVar5;
          local_88 = uVar7;
        }
      }
      else {
        bVar11 = false;
      }
      if (!bVar11) {
        data[uVar6 - 1] = uVar9;
      }
      uVar8 = uVar6;
      uVar9 = *puVar4;
    }
    uVar6 = uVar8 + 1;
    if (local_88 < uVar6) {
      uVar7 = uVar6 * 3 >> 1;
      if (local_88 * 2 < uVar6) {
        uVar7 = uVar6;
      }
      puVar4 = (uchar *)realloc(data,uVar7);
      if (puVar4 == (uchar *)0x0) {
        bVar11 = true;
        uVar6 = uVar8;
      }
      else {
        bVar11 = false;
        data = puVar4;
        local_88 = uVar7;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar6 - 1] = '\0';
    }
    uVar9 = *local_38;
    puVar4 = local_38;
    while (uVar9 != '\0') {
      puVar4 = puVar4 + 1;
      uVar8 = uVar6 + 1;
      if (local_88 < uVar8) {
        uVar7 = uVar8 * 3 >> 1;
        if (local_88 * 2 < uVar8) {
          uVar7 = uVar8;
        }
        puVar5 = (uchar *)realloc(data,uVar7);
        if (puVar5 == (uchar *)0x0) {
          bVar11 = true;
          uVar8 = uVar6;
        }
        else {
          bVar11 = false;
          data = puVar5;
          local_88 = uVar7;
        }
      }
      else {
        bVar11 = false;
      }
      if (!bVar11) {
        data[uVar8 - 1] = uVar9;
      }
      uVar6 = uVar8;
      uVar9 = *puVar4;
    }
    uVar8 = uVar6 + 1;
    if (local_88 < uVar8) {
      uVar7 = uVar8 * 3 >> 1;
      if (local_88 * 2 < uVar8) {
        uVar7 = uVar8;
      }
      puVar4 = (uchar *)realloc(data,uVar7);
      if (puVar4 == (uchar *)0x0) {
        bVar11 = true;
        uVar8 = uVar6;
      }
      else {
        bVar11 = false;
        data = puVar4;
        local_88 = uVar7;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar8 - 1] = '\0';
    }
    if (compressed == 0) {
      uVar9 = *textstring;
      while (uVar9 != '\0') {
        textstring = (char *)((uchar *)textstring + 1);
        uVar6 = uVar8 + 1;
        if (local_88 < uVar6) {
          uVar7 = uVar6 * 3 >> 1;
          if (local_88 * 2 < uVar6) {
            uVar7 = uVar6;
          }
          puVar4 = (uchar *)realloc(data,uVar7);
          if (puVar4 == (uchar *)0x0) {
            bVar11 = true;
            uVar6 = uVar8;
          }
          else {
            bVar11 = false;
            data = puVar4;
            local_88 = uVar7;
          }
        }
        else {
          bVar11 = false;
        }
        if (!bVar11) {
          data[uVar6 - 1] = uVar9;
        }
        uVar8 = uVar6;
        uVar9 = *textstring;
      }
      uVar3 = (uint)uVar8;
      bVar11 = true;
    }
    else {
      local_58 = (uchar *)0x0;
      sStack_50 = 0;
      local_48 = 0;
      if (zlibsettings->custom_zlib ==
          (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
        uVar2 = lodepng_zlib_compress(&local_58,&sStack_50,(uchar *)textstring,sVar10,zlibsettings);
      }
      else {
        uVar2 = (*zlibsettings->custom_zlib)
                          (&local_58,&sStack_50,(uchar *)textstring,sVar10,zlibsettings);
      }
      if ((uVar2 == 0) && (sStack_50 != 0)) {
        sVar10 = 0;
        uVar6 = uVar8;
        do {
          uVar9 = local_58[sVar10];
          uVar8 = uVar6 + 1;
          if (local_88 < uVar8) {
            uVar7 = uVar8 * 3 >> 1;
            if (local_88 * 2 < uVar8) {
              uVar7 = uVar8;
            }
            puVar4 = (uchar *)realloc(data,uVar7);
            if (puVar4 == (uchar *)0x0) {
              bVar11 = true;
              uVar8 = uVar6;
            }
            else {
              bVar11 = false;
              data = puVar4;
              local_88 = uVar7;
            }
          }
          else {
            bVar11 = false;
          }
          if (!bVar11) {
            data[uVar8 - 1] = uVar9;
          }
          sVar10 = sVar10 + 1;
          uVar6 = uVar8;
        } while (sVar10 != sStack_50);
      }
      uVar3 = (uint)uVar8;
      sStack_50 = 0;
      local_48 = 0;
      free(local_58);
      bVar11 = uVar2 == 0;
    }
    if ((bVar11) &&
       (uVar3 = lodepng_chunk_create(&out->data,&out->size,uVar3,"iTXt",data), uVar3 == 0)) {
      out->allocsize = out->size;
    }
    free(data);
    uVar3 = extraout_EAX;
  }
  return uVar3;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compressed, const char* keyword, const char* langtag,
                              const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  ucvector data;
  size_t i, textsize = lodepng_strlen(textstring);

  ucvector_init(&data);

  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*null termination char*/
  ucvector_push_back(&data, compressed ? 1 : 0); /*compression flag*/
  ucvector_push_back(&data, 0); /*compression method*/
  for(i = 0; langtag[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)langtag[i]);
  ucvector_push_back(&data, 0); /*null termination char*/
  for(i = 0; transkey[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)transkey[i]);
  ucvector_push_back(&data, 0); /*null termination char*/

  if(compressed) {
    ucvector compressed_data;
    ucvector_init(&compressed_data);
    error = zlib_compress(&compressed_data.data, &compressed_data.size,
                          (const unsigned char*)textstring, textsize, zlibsettings);
    if(!error) {
      for(i = 0; i != compressed_data.size; ++i) ucvector_push_back(&data, compressed_data.data[i]);
    }
    ucvector_cleanup(&compressed_data);
  } else /*not compressed*/ {
    for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)textstring[i]);
  }

  if(!error) error = addChunk(out, "iTXt", data.data, data.size);
  ucvector_cleanup(&data);
  return error;
}